

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDar.c
# Opt level: O0

Vec_Ptr_t * Abc_NtkCollectCiNames(Abc_Ntk_t *pNtk)

{
  int iVar1;
  Vec_Ptr_t *p;
  Abc_Obj_t *pObj_00;
  char *pcVar2;
  Vec_Ptr_t *vNames;
  int i;
  Abc_Obj_t *pObj;
  Abc_Ntk_t *pNtk_local;
  
  p = Vec_PtrAlloc(100);
  for (vNames._4_4_ = 0; iVar1 = Abc_NtkCiNum(pNtk), vNames._4_4_ < iVar1;
      vNames._4_4_ = vNames._4_4_ + 1) {
    pObj_00 = Abc_NtkCi(pNtk,vNames._4_4_);
    pcVar2 = Abc_ObjName(pObj_00);
    pcVar2 = Extra_UtilStrsav(pcVar2);
    Vec_PtrPush(p,pcVar2);
  }
  return p;
}

Assistant:

Vec_Ptr_t * Abc_NtkCollectCiNames( Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pObj;
    int i;
    Vec_Ptr_t * vNames;
    vNames = Vec_PtrAlloc( 100 );
    Abc_NtkForEachCi( pNtk, pObj, i )
        Vec_PtrPush( vNames, Extra_UtilStrsav(Abc_ObjName(pObj)) );
    return vNames;
}